

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConsequenceFinder.cpp
# Opt level: O0

void __thiscall
Saturation::ConsequenceFinder::onNewPropositionalClause(ConsequenceFinder *this,Clause *cl)

{
  Term *pTVar1;
  bool bVar2;
  Clause *pCVar3;
  Elem ppLVar4;
  Symbol *this_00;
  Signature *this_01;
  ostream *poVar5;
  bool *pbVar6;
  string *psVar7;
  Clause *in_RSI;
  Clause *in_stack_00000008;
  uint red;
  Literal *l;
  StlIter __end1;
  StlIter __begin1;
  DuplicateLiteralRemovalISE *in_stack_00000088;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
  *__range1;
  bool horn;
  Literal *pos;
  bool dlrSimplified;
  Clause *dlrCl;
  StlIter *in_stack_ffffffffffffff28;
  Signature *in_stack_ffffffffffffff30;
  Clause *in_stack_ffffffffffffff40;
  string local_98 [24];
  Clause *in_stack_ffffffffffffff80;
  TautologyDeletionISE *in_stack_ffffffffffffff88;
  Term *this_02;
  undefined1 local_50 [24];
  undefined1 *local_38;
  byte local_29;
  Term *local_28;
  undefined1 local_19;
  Clause *local_18;
  Clause *local_10;
  
  local_10 = in_RSI;
  local_18 = Inferences::DuplicateLiteralRemovalISE::simplify
                       (in_stack_00000088,
                        (Clause *)
                        __begin1._cur.super_OptionBase<Kernel::Literal_*&>.
                        super_OptionBaseRef<Kernel::Literal_**>._elem);
  local_19 = local_18 != local_10;
  if ((bool)local_19) {
    Kernel::Clause::destroyIfUnnecessary((Clause *)in_stack_ffffffffffffff30);
  }
  else {
    bVar2 = Kernel::Clause::noSplits((Clause *)in_stack_ffffffffffffff30);
    if ((bVar2) &&
       (pCVar3 = Inferences::TautologyDeletionISE::simplify
                           (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80),
       pCVar3 != (Clause *)0x0)) {
      local_28 = (Term *)0x0;
      local_29 = 1;
      Kernel::Clause::iterLits(in_stack_ffffffffffffff40);
      local_38 = local_50;
      Lib::
      IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
      ::begin((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
               *)in_stack_ffffffffffffff28);
      Lib::
      IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
      ::end((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
             *)in_stack_ffffffffffffff28);
      while (bVar2 = Lib::operator!=((StlIter *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28)
            , bVar2) {
        ppLVar4 = Lib::
                  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
                  ::StlIter::operator*((StlIter *)0xac2a48);
        this_02 = &(*ppLVar4)->super_Term;
        Kernel::Term::functor(this_02);
        this_00 = Kernel::Signature::getPredicate
                            (in_stack_ffffffffffffff30,
                             (uint)((ulong)in_stack_ffffffffffffff28 >> 0x20));
        bVar2 = Kernel::Signature::Symbol::label(this_00);
        if (!bVar2) {
          return;
        }
        bVar2 = Kernel::Literal::isPositive((Literal *)0xac2a91);
        pTVar1 = local_28;
        if ((bVar2) && (pTVar1 = this_02, local_28 != (Term *)0x0)) {
          local_29 = 0;
          pTVar1 = local_28;
        }
        local_28 = pTVar1;
        Lib::
        IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
        ::StlIter::operator++((StlIter *)in_stack_ffffffffffffff30);
      }
      this_01 = (Signature *)std::operator<<((ostream *)&std::cout,"Pure cf clause: ");
      Kernel::Clause::toNiceString_abi_cxx11_(in_stack_00000008);
      poVar5 = std::operator<<((ostream *)this_01,local_98);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_98);
      if (((local_29 & 1) != 0) && (local_28 != (Term *)0x0)) {
        Kernel::Term::functor(local_28);
        pbVar6 = Lib::Array<bool>::operator[]
                           ((Array<bool> *)this_01,(size_t)in_stack_ffffffffffffff28);
        if ((*pbVar6 & 1U) == 0) {
          pbVar6 = Lib::Array<bool>::operator[]
                             ((Array<bool> *)this_01,(size_t)in_stack_ffffffffffffff28);
          *pbVar6 = true;
          Lib::Stack<unsigned_int>::push
                    ((Stack<unsigned_int> *)this_01,(uint)((ulong)in_stack_ffffffffffffff28 >> 0x20)
                    );
          poVar5 = std::operator<<((ostream *)&std::cout,"Consequence found: ");
          psVar7 = Kernel::Signature::predicateName_abi_cxx11_(this_01,(int)((ulong)poVar5 >> 0x20))
          ;
          poVar5 = std::operator<<(poVar5,(string *)psVar7);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
      }
    }
  }
  return;
}

Assistant:

void ConsequenceFinder::onNewPropositionalClause(Clause* cl)
{
  TIME_TRACE(TimeTrace::CONSEQUENCE_FINDING);

  //remove duplicate literals (necessary for tautology deletion)
  Clause* dlrCl=_dlr.simplify(cl);

  bool dlrSimplified=dlrCl!=cl;
  if(dlrSimplified) {
    //the function will be called again with the clause that is already simplified
    //TODO: get some cheaper way of testing for duplicate literals presence
    dlrCl->destroyIfUnnecessary();
    return;
  }


  if(!cl->noSplits() || !_td.simplify(cl)) {
    return;
  }
  Literal* pos=0;
  bool horn=true;
  for (auto l : cl->iterLits()) {
    if(!env.signature->getPredicate(l->functor())->label()) {
      return;
    }
    if(l->isPositive()) {
      if(pos) {
        horn=false;
      }
      else {
        pos=l;
      }
    }
  }

  std::cout << "Pure cf clause: " << cl->toNiceString() <<endl;

  if(!horn || !pos) {
    return;
  }

  unsigned red=pos->functor(); //redundant cf symbol number
  if(_redundant[red]) {
    return;
  }
  _redundant[red]=true;

  //we will remove the redundant clauses later -- now we may be at some unsuitable part
  //of the saturation algorithm loop
  _redundantsToHandle.push(red);

  std::cout << "Consequence found: " << env.signature->predicateName(red) << endl;
}